

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Float __thiscall
pbrt::TrowbridgeReitzDistribution::Lambda(TrowbridgeReitzDistribution *this,Vector3f *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  Vector3f w_00;
  Float FVar3;
  
  fVar4 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar6._0_12_ = ZEXT812(0);
  auVar6._12_4_ = 0;
  fVar5 = 0.0;
  auVar6 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar4 * fVar4)),auVar6);
  fVar7 = auVar6._0_4_ / (fVar4 * fVar4);
  if (ABS(fVar7) != INFINITY) {
    uVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
    w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
    w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    w_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar4;
    FVar3 = CosPhi(w_00);
    fVar4 = FVar3 * this->alpha_x;
    FVar3 = SinPhi((Vector3f)w->super_Tuple3<pbrt::Vector3,_float>);
    fVar5 = FVar3 * this->alpha_y;
    auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)(fVar5 * fVar5 + fVar4 * fVar4)),
                             ZEXT416(0x3f800000));
    if (auVar6._0_4_ < 0.0) {
      fVar4 = sqrtf(auVar6._0_4_);
    }
    else {
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar4 = auVar6._0_4_;
    }
    fVar5 = (fVar4 + -1.0) * 0.5;
  }
  return fVar5;
}

Assistant:

PBRT_CPU_GPU
    Float Lambda(const Vector3f &w) const {
        Float tan2Theta = Tan2Theta(w);
        if (IsInf(tan2Theta))
            return 0.;
        // Compute _alpha2_ for direction _w_
        Float alpha2 = Sqr(CosPhi(w) * alpha_x) + Sqr(SinPhi(w) * alpha_y);

        return (-1 + std::sqrt(1 + alpha2 * tan2Theta)) / 2;
    }